

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O2

void __thiscall
diy::Master::iexchange<bool(*)(Block*,diy::Master::ProxyWithLink_const&)>
          (Master *this,_func_bool_Block_ptr_ProxyWithLink_ptr **f,MemoryManagement *mem)

{
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  MemoryManagement local_68;
  
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (_func_bool_Block_ptr_ProxyWithLink_ptr *)0x0;
  local_88._8_8_ = 0;
  if (*f != (_func_bool_Block_ptr_ProxyWithLink_ptr *)0x0) {
    pcStack_70 = std::
                 _Function_handler<bool_(Block_*,_const_diy::Master::ProxyWithLink_&),_bool_(*)(Block_*,_const_diy::Master::ProxyWithLink_&)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<bool_(Block_*,_const_diy::Master::ProxyWithLink_&),_bool_(*)(Block_*,_const_diy::Master::ProxyWithLink_&)>
               ::_M_manager;
    local_88._M_unused._0_8_ = (undefined8)*f;
  }
  MemoryManagement::MemoryManagement(&local_68,mem);
  iexchange_<Block>(this,(ICallback<Block> *)&local_88,&local_68);
  MemoryManagement::~MemoryManagement(&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  return;
}

Assistant:

void          iexchange(const F& f, MemoryManagement mem = MemoryManagement())
      {
          using Block = typename detail::block_traits<F>::type;
          iexchange_<Block>(f, mem);
      }